

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_test.cc
# Opt level: O3

void __thiscall
fizplex::LPTestFeasibility_IsFeasibleForBoundedVarAndRangeRow_Test::
~LPTestFeasibility_IsFeasibleForBoundedVarAndRangeRow_Test
          (LPTestFeasibility_IsFeasibleForBoundedVarAndRangeRow_Test *this)

{
  pointer pRVar1;
  pointer pCVar2;
  
  (this->super_LPTestFeasibility).super_Test._vptr_Test =
       (_func_int **)&PTR__LPTestFeasibility_001c13d0;
  pRVar1 = (this->super_LPTestFeasibility).lp.rows.
           super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pRVar1 != (pointer)0x0) {
    operator_delete(pRVar1,(long)(this->super_LPTestFeasibility).lp.rows.
                                 super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pRVar1);
  }
  pCVar2 = (this->super_LPTestFeasibility).lp.cols.
           super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pCVar2 != (pointer)0x0) {
    operator_delete(pCVar2,(long)(this->super_LPTestFeasibility).lp.cols.
                                 super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pCVar2);
  }
  operator_delete((this->super_LPTestFeasibility).lp.c.vals._M_data);
  operator_delete((this->super_LPTestFeasibility).lp.b.vals._M_data);
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector
            ((vector<fizplex::SVector,_std::allocator<fizplex::SVector>_> *)
             &(this->super_LPTestFeasibility).lp);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x98);
  return;
}

Assistant:

TEST_F(LPTestFeasibility, IsFeasibleForBoundedVarAndRangeRow) {
  lp.add_column(ColType::Bounded, -1.0, 5);
  lp.add_row(RowType::Range, -3, 7);
  lp.add_value(0, 0, 2.0);
  lp.add_logicals();

  check_feasible(true, {{0, 7}, {-1, 9}, {3.5, 0}});
  check_feasible(false, {{-1.5, 0}, {4, 0}});
}